

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsdl-parser.cpp
# Opt level: O3

void __thiscall yactfr::internal::TsdlParser::_addPseudoDtRoles(TsdlParser *this)

{
  undefined **ppuVar1;
  pointer pcVar2;
  PseudoDt *pPVar3;
  long *plVar4;
  byte bVar5;
  long lVar6;
  char *__end;
  TsdlParser *this_00;
  long *plVar7;
  DefClkTsRoleAdder visitor;
  undefined1 local_50 [32];
  
  _setImplicitMappedClkTypeId(this);
  bVar5 = (this->_pseudoTraceType).super_type.m_initialized;
  if ((bool)bVar5 == false) goto LAB_00242fa9;
  pPVar3 = *(PseudoDt **)((long)&(this->_pseudoTraceType).super_type.m_storage.dummy_ + 0xb8);
  if (pPVar3 != (PseudoDt *)0x0) {
    ppuVar1 = (undefined **)(local_50 + 0x10);
    local_50._0_8_ = ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"magic","");
    _addPseudoFlUIntTypeRoles<false>(this,pPVar3,(string *)local_50,PacketMagicNumber);
    if ((undefined **)local_50._0_8_ != ppuVar1) {
      operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
    }
    if ((this->_pseudoTraceType).super_type.m_initialized == false) goto LAB_00242fa9;
    pPVar3 = *(PseudoDt **)((long)&(this->_pseudoTraceType).super_type.m_storage.dummy_ + 0xb8);
    local_50._0_8_ = ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"stream_id","");
    _addPseudoFlUIntTypeRoles<false>(this,pPVar3,(string *)local_50,DataStreamTypeId);
    if ((undefined **)local_50._0_8_ != ppuVar1) {
      operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
    }
    if ((this->_pseudoTraceType).super_type.m_initialized == false) goto LAB_00242fa9;
    pPVar3 = *(PseudoDt **)((long)&(this->_pseudoTraceType).super_type.m_storage.dummy_ + 0xb8);
    local_50._0_8_ = ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"stream_instance_id","");
    _addPseudoFlUIntTypeRoles<false>(this,pPVar3,(string *)local_50,DataStreamId);
    if ((undefined **)local_50._0_8_ != ppuVar1) {
      operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
    }
    if ((this->_pseudoTraceType).super_type.m_initialized == false) goto LAB_00242fa9;
    pPVar3 = *(PseudoDt **)((long)&(this->_pseudoTraceType).super_type.m_storage.dummy_ + 0xb8);
    this_00 = (TsdlParser *)local_50;
    local_50._0_8_ = ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)this_00,"uuid","");
    _setPseudoSlArrayTypeMetadataStreamUuidRole(this_00,pPVar3,(string *)local_50);
    if ((undefined **)local_50._0_8_ != ppuVar1) {
      operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
    }
    bVar5 = (this->_pseudoTraceType).super_type.m_initialized;
  }
  if ((bVar5 & 1) != 0) {
    plVar7 = *(long **)((long)&(this->_pseudoTraceType).super_type.m_storage.dummy_ + 0x100);
    if (plVar7 != (long *)0x0) {
      pcVar2 = local_50 + 0x10;
      do {
        lVar6 = plVar7[2];
        pPVar3 = *(PseudoDt **)(lVar6 + 0x88);
        if (pPVar3 != (PseudoDt *)0x0) {
          local_50._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"packet_size","");
          _addPseudoFlUIntTypeRoles<false>(this,pPVar3,(string *)local_50,PacketTotalLength);
          if ((pointer)local_50._0_8_ != pcVar2) {
            operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
          }
          pPVar3 = *(PseudoDt **)(plVar7[2] + 0x88);
          local_50._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"content_size","");
          _addPseudoFlUIntTypeRoles<false>(this,pPVar3,(string *)local_50,PacketContentLength);
          if ((pointer)local_50._0_8_ != pcVar2) {
            operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
          }
          pPVar3 = *(PseudoDt **)(plVar7[2] + 0x88);
          local_50._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"packet_size","");
          _addPseudoFlUIntTypeRoles<false>(this,pPVar3,(string *)local_50,PacketTotalLength);
          if ((pointer)local_50._0_8_ != pcVar2) {
            operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
          }
          pPVar3 = *(PseudoDt **)(plVar7[2] + 0x88);
          local_50._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"timestamp_end","");
          _addPseudoFlUIntTypeRoles<true>
                    (this,pPVar3,(string *)local_50,PacketEndDefaultClockTimestamp);
          if ((pointer)local_50._0_8_ != pcVar2) {
            operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
          }
          pPVar3 = *(PseudoDt **)(plVar7[2] + 0x88);
          local_50._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"events_discarded","");
          _addPseudoFlUIntTypeRoles<false>
                    (this,pPVar3,(string *)local_50,DiscardedEventRecordCounterSnapshot);
          if ((pointer)local_50._0_8_ != pcVar2) {
            operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
          }
          pPVar3 = *(PseudoDt **)(plVar7[2] + 0x88);
          local_50._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"packet_seq_num","");
          _addPseudoFlUIntTypeRoles<false>(this,pPVar3,(string *)local_50,PacketSequenceNumber);
          if ((pointer)local_50._0_8_ != pcVar2) {
            operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
          }
          lVar6 = plVar7[2];
        }
        pPVar3 = *(PseudoDt **)(lVar6 + 0x90);
        if (pPVar3 != (PseudoDt *)0x0) {
          local_50._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"id","");
          _addPseudoFlUIntTypeRoles<false>(this,pPVar3,(string *)local_50,EventRecordTypeId);
          if ((pointer)local_50._0_8_ != pcVar2) {
            operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
          }
        }
        plVar7 = (long *)*plVar7;
      } while (plVar7 != (long *)0x0);
      bVar5 = (this->_pseudoTraceType).super_type.m_initialized;
    }
    local_50._0_8_ = &PTR__PseudoDtVisitor_002fe1a0;
    if ((bVar5 & 1) != 0) {
      plVar7 = *(long **)((long)&(this->_pseudoTraceType).super_type.m_storage.dummy_ + 0x100);
      if (plVar7 != (long *)0x0) {
        do {
          lVar6 = plVar7[2];
          plVar4 = *(long **)(lVar6 + 0x88);
          if (plVar4 != (long *)0x0) {
            (**(code **)(*plVar4 + 0x20))(plVar4,local_50);
            lVar6 = plVar7[2];
          }
          plVar4 = *(long **)(lVar6 + 0x90);
          if (plVar4 != (long *)0x0) {
            (**(code **)(*plVar4 + 0x20))(plVar4,local_50);
          }
          plVar7 = (long *)*plVar7;
        } while (plVar7 != (long *)0x0);
      }
      return;
    }
  }
LAB_00242fa9:
  __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4c6,
                "pointer_type boost::optional<yactfr::internal::PseudoTraceType>::operator->() [T = yactfr::internal::PseudoTraceType]"
               );
}

Assistant:

void TsdlParser::_addPseudoDtRoles()
{
    /*
     * First, set an implicit mapped clock type internal ID on specific
     * pseudo fixed-length unsigned integer types.
     *
     * For example, if the current pseudo trace type contains a single
     * clock type, then any pseudo fixed-length unsigned integer type
     * named `timestamp` within pseudo event record header types, which
     * are not already mapped to a clock type, are mapped to this single
     * clock type.
     */
    this->_setImplicitMappedClkTypeId();

    // add/set simple roles
    if (_pseudoTraceType->pseudoPktHeaderType()) {
        this->_addPseudoFlUIntTypeRoles(*_pseudoTraceType->pseudoPktHeaderType(), "magic",
                                        UnsignedIntegerTypeRole::PacketMagicNumber);
        this->_addPseudoFlUIntTypeRoles(*_pseudoTraceType->pseudoPktHeaderType(), "stream_id",
                                        UnsignedIntegerTypeRole::DataStreamTypeId);
        this->_addPseudoFlUIntTypeRoles(*_pseudoTraceType->pseudoPktHeaderType(),
                                        "stream_instance_id",
                                        UnsignedIntegerTypeRole::DataStreamId);
        this->_setPseudoSlArrayTypeMetadataStreamUuidRole(*_pseudoTraceType->pseudoPktHeaderType(),
                                                          "uuid");
    }

    for (auto& idPseudoDstPair : _pseudoTraceType->pseudoDsts()) {
        auto& pseudoDst = idPseudoDstPair.second;

        if (pseudoDst->pseudoPktCtxType()) {
            this->_addPseudoFlUIntTypeRoles(*pseudoDst->pseudoPktCtxType(), "packet_size",
                                            UnsignedIntegerTypeRole::PacketTotalLength);
            this->_addPseudoFlUIntTypeRoles(*pseudoDst->pseudoPktCtxType(), "content_size",
                                            UnsignedIntegerTypeRole::PacketContentLength);
            this->_addPseudoFlUIntTypeRoles(*pseudoDst->pseudoPktCtxType(), "packet_size",
                                            UnsignedIntegerTypeRole::PacketTotalLength);
            this->_addPseudoFlUIntTypeRoles<true>(*pseudoDst->pseudoPktCtxType(), "timestamp_end",
                                                  UnsignedIntegerTypeRole::PacketEndDefaultClockTimestamp);
            this->_addPseudoFlUIntTypeRoles(*pseudoDst->pseudoPktCtxType(), "events_discarded",
                                            UnsignedIntegerTypeRole::DiscardedEventRecordCounterSnapshot);
            this->_addPseudoFlUIntTypeRoles(*pseudoDst->pseudoPktCtxType(), "packet_seq_num",
                                            UnsignedIntegerTypeRole::PacketSequenceNumber);
        }

        if (pseudoDst->pseudoErHeaderType()) {
            this->_addPseudoFlUIntTypeRoles(*pseudoDst->pseudoErHeaderType(), "id",
                                            UnsignedIntegerTypeRole::EventRecordTypeId);
        }
    }

    // add "default clock timestamp" role
    DefClkTsRoleAdder visitor;

    for (auto& idPseudoDstPair : _pseudoTraceType->pseudoDsts()) {
        auto& pseudoDst = idPseudoDstPair.second;

        if (pseudoDst->pseudoPktCtxType()) {
            pseudoDst->pseudoPktCtxType()->accept(visitor);
        }

        if (pseudoDst->pseudoErHeaderType()) {
            pseudoDst->pseudoErHeaderType()->accept(visitor);
        }
    }
}